

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O2

bool __thiscall QFileDevice::unmap(QFileDevice *this,uchar *address)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  FileError FVar6;
  undefined4 extraout_var;
  bool bVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  iVar5 = (*pQVar1->_vptr_QObjectData[7])(pQVar1);
  if (CONCAT44(extraout_var,iVar5) != 0) {
    pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
    cVar3 = (**(code **)(pQVar2->currentlyEvaluatingBinding[2].alreadyCaptureProperties.
                         super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x28))(pQVar2,3);
    if (cVar3 != '\0') {
      unsetError(this);
      bVar4 = QAbstractFileEngine::unmap
                        ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus,address);
      bVar7 = true;
      if (!bVar4) {
        FVar6 = QAbstractFileEngine::error
                          ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
        QAbstractFileEngine::errorString
                  ((QString *)&local_40,
                   (QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
        *(FileError *)((long)&pQVar1[5].q_ptr + 4) = FVar6;
        QString::operator=((QString *)&pQVar1[4].children.d.size,(QString *)&local_40);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
        bVar7 = false;
      }
      goto LAB_002216ce;
    }
  }
  bVar7 = false;
  tr((QString *)&local_40,"No file engine available or engine does not support UnMapExtension",
     (char *)0x0,-1);
  *(undefined4 *)((long)&pQVar1[5].q_ptr + 4) = 0xd;
  QString::operator=((QString *)&pQVar1[4].children.d.size,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
LAB_002216ce:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::unmap(uchar *address)
{
    Q_D(QFileDevice);
    if (d->engine()
        && d->fileEngine->supportsExtension(QAbstractFileEngine::UnMapExtension)) {
        unsetError();
        bool success = d->fileEngine->unmap(address);
        if (!success)
            d->setError(d->fileEngine->error(), d->fileEngine->errorString());
        return success;
    }
    d->setError(PermissionsError, tr("No file engine available or engine does not support UnMapExtension"));
    return false;
}